

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

int __thiscall libtorrent::aux::torrent::current_stats_state(torrent *this)

{
  bool bVar1;
  state_t sVar2;
  torrent *this_local;
  
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
     ((char)this->field_0x5c0 < '\0')) {
    bVar1 = has_error(this);
    if (bVar1) {
      this_local._4_4_ = 0xda;
    }
    else if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) == 0) &&
            ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f & 1) == 0)) {
      sVar2 = state(this);
      if (sVar2 == checking_files) {
        this_local._4_4_ = 0xd3;
      }
      else {
        bVar1 = is_seed(this);
        if (bVar1) {
          this_local._4_4_ = 0xd7;
        }
        else {
          bVar1 = is_upload_only(this);
          if (bVar1) {
            this_local._4_4_ = 0xd5;
          }
          else {
            this_local._4_4_ = 0xd6;
          }
        }
      }
    }
    else {
      bVar1 = is_auto_managed(this);
      if (bVar1) {
        bVar1 = is_seed(this);
        if (bVar1) {
          this_local._4_4_ = 0xd8;
        }
        else {
          this_local._4_4_ = 0xd9;
        }
      }
      else {
        this_local._4_4_ = 0xd4;
      }
    }
  }
  else {
    this_local._4_4_ = 0xe2;
  }
  return this_local._4_4_;
}

Assistant:

int torrent::current_stats_state() const
	{
		if (m_abort || !m_added)
			return counters::num_checking_torrents + no_gauge_state;

		if (has_error()) return counters::num_error_torrents;
		if (m_paused || m_graceful_pause_mode)
		{
			if (!is_auto_managed()) return counters::num_stopped_torrents;
			if (is_seed()) return counters::num_queued_seeding_torrents;
			return counters::num_queued_download_torrents;
		}
		if (state() == torrent_status::checking_files
#if TORRENT_ABI_VERSION == 1
			|| state() == torrent_status::queued_for_checking
#endif
			)
			return counters::num_checking_torrents;
		else if (is_seed()) return counters::num_seeding_torrents;
		else if (is_upload_only()) return counters::num_upload_only_torrents;
		return counters::num_downloading_torrents;
	}